

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context_state.hpp
# Opt level: O3

void __thiscall
duckdb::RegisteredStateManager::Insert
          (RegisteredStateManager *this,string *key,
          shared_ptr<duckdb::ClientContextState,_true> *state_p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  undefined8 uVar4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ClientContextState,_true>_>
  local_50;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 == 0) {
    paVar1 = &local_50.first.field_2;
    pcVar2 = (key->_M_dataplus)._M_p;
    local_50.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar2,pcVar2 + key->_M_string_length);
    local_50.second.internal.
    super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         *(undefined4 *)
          &(state_p->internal).
           super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50.second.internal.
    super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
         *(undefined4 *)
          ((long)&(state_p->internal).
                  super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          + 4);
    local_50.second.internal.
    super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _0_4_ = *(undefined4 *)
             &(state_p->internal).
              super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
    local_50.second.internal.
    super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _4_4_ = *(undefined4 *)
             ((long)&(state_p->internal).
                     super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4);
    (state_p->internal).super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (state_p->internal).super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::ClientContextState,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::ClientContextState,true>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_emplace<std::pair<std::__cxx11::string,duckdb::shared_ptr<duckdb::ClientContextState,true>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::ClientContextState,true>>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::shared_ptr<duckdb::ClientContextState,true>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->registered_state);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(local_50.second.internal.
                 super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._4_4_,
                 local_50.second.internal.
                 super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._0_4_) != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(local_50.second.internal.
                          super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._4_4_,
                          local_50.second.internal.
                          super___shared_ptr<duckdb::ClientContextState,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount._M_pi._0_4_));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_50.first._M_dataplus._M_p);
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  uVar4 = std::__throw_system_error(iVar3);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::ClientContextState,_true>_>
  ::~pair(&local_50);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  _Unwind_Resume(uVar4);
}

Assistant:

void Insert(const string &key, shared_ptr<ClientContextState> state_p) {
		lock_guard<mutex> l(lock);
		registered_state.insert(make_pair(key, std::move(state_p)));
	}